

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O1

string * __thiscall
toml::format<char_const(&)[5],std::__cxx11::string_const&,char_const(&)[16]>
          (string *__return_storage_ptr__,toml *this,stringstream *ss,char (*t) [5],
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args,
          char (*args_1) [16])

{
  size_t sVar1;
  char (*t_00) [16];
  
  t_00 = (char (*) [16])t;
  sVar1 = strlen((char *)ss);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)(this + 0x10),(char *)ss,sVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(this + 0x10),*(char **)t,*(long *)(t[1] + 3));
  format<char_const(&)[16]>(__return_storage_ptr__,this,(stringstream *)args,t_00);
  return __return_storage_ptr__;
}

Assistant:

std::string format(std::stringstream& ss, T&& t, Args&&... args)
{
    ss << std::forward<T>(t);
    return format(ss, std::forward<Args>(args)...);
}